

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void output_GLSL_uniform_array(Context *ctx,RegisterType regtype,int size)

{
  char *local_60;
  char *typ;
  char buf [64];
  int size_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  if (0 < size) {
    buf._56_4_ = size;
    buf._60_4_ = regtype;
    get_GLSL_uniform_array_varname(ctx,regtype,(char *)&typ,0x40);
    if (buf._60_4_ == 2) {
      local_60 = "vec4";
    }
    else if (buf._60_4_ == 7) {
      local_60 = "ivec4";
    }
    else {
      if (buf._60_4_ != 0xe) {
        fail(ctx,"BUG: used a uniform we don\'t know how to define.");
        return;
      }
      local_60 = "bool";
    }
    output_line(ctx,"uniform %s %s[%d];",local_60,&typ,(ulong)(uint)buf._56_4_);
  }
  return;
}

Assistant:

static void output_GLSL_uniform_array(Context *ctx, const RegisterType regtype,
                                      const int size)
{
    if (size > 0)
    {
        char buf[64];
        get_GLSL_uniform_array_varname(ctx, regtype, buf, sizeof (buf));
        const char *typ;
        switch (regtype)
        {
            case REG_TYPE_CONST: typ = "vec4"; break;
            case REG_TYPE_CONSTINT: typ ="ivec4"; break;
            case REG_TYPE_CONSTBOOL: typ = "bool"; break;
            default:
            {
                fail(ctx, "BUG: used a uniform we don't know how to define.");
                return;
            } // default
        } // switch
        output_line(ctx, "uniform %s %s[%d];", typ, buf, size);
    } // if
}